

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_jump_stmt(gvisitor_t *self,gnode_jump_stmt_t *node)

{
  gtoken_t gVar1;
  long *plVar2;
  ircode_t *code_00;
  uint32_t uVar3;
  uint32_t local_84;
  uint32_t local_74;
  uint32_t local_64;
  uint32_t local_54;
  uint32_t reg;
  uint32_t label_1;
  uint32_t label;
  gtoken_t type;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_jump_stmt_t *node_local;
  gvisitor_t *self_local;
  
  plVar2 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar2 == (long *)0x0) || ((gravity_class_t *)*plVar2 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar2[0x14];
    gVar1 = (node->base).token.type;
    if (((gVar1 != TOK_KEY_BREAK) && (gVar1 != TOK_KEY_CONTINUE)) && (gVar1 != TOK_KEY_RETURN)) {
      __assert_fail("(type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                    ,800,"void visit_jump_stmt(gvisitor_t *, gnode_jump_stmt_t *)");
    }
    if (gVar1 == TOK_KEY_BREAK) {
      uVar3 = ircode_getlabel_false(code_00);
      if (node == (gnode_jump_stmt_t *)0x0) {
        local_54 = 0;
      }
      else {
        local_54 = (node->base).token.lineno;
      }
      ircode_add(code_00,JUMP,uVar3,0,0,local_54);
    }
    else if (gVar1 == TOK_KEY_CONTINUE) {
      uVar3 = ircode_getlabel_check(code_00);
      if (node == (gnode_jump_stmt_t *)0x0) {
        local_64 = 0;
      }
      else {
        local_64 = (node->base).token.lineno;
      }
      ircode_add(code_00,JUMP,uVar3,0,0,local_64);
    }
    else if (gVar1 == TOK_KEY_RETURN) {
      if (node->expr == (gnode_t *)0x0) {
        if (node == (gnode_jump_stmt_t *)0x0) {
          local_84 = 0;
        }
        else {
          local_84 = (node->base).token.lineno;
        }
        ircode_add(code_00,RET0,0,0,0,local_84);
      }
      else {
        gvisit(self,node->expr);
        uVar3 = ircode_register_pop(code_00);
        if (uVar3 == 0xffffffff) {
          report_error(self,&node->base,"Invalid return expression.");
        }
        if (node == (gnode_jump_stmt_t *)0x0) {
          local_74 = 0;
        }
        else {
          local_74 = (node->base).token.lineno;
        }
        ircode_add(code_00,RET,uVar3,0,0,local_74);
      }
    }
  }
  return;
}

Assistant:

static void visit_jump_stmt (gvisitor_t *self, gnode_jump_stmt_t *node) {
    DEBUG_CODEGEN("visit_jump_stmt");
    DECLARE_CODE();

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN));

    if (type == TOK_KEY_BREAK) {
        uint32_t label = ircode_getlabel_false(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $end;
    } else if (type == TOK_KEY_CONTINUE) {
        uint32_t label = ircode_getlabel_check(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $start;
    } else if (type == TOK_KEY_RETURN) {
        if (node->expr) {
            visit(node->expr);
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid return expression.");
			ircode_add(code, RET, reg, 0, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, RET0, 0, 0, 0, LINE_NUMBER(node));
        }
    }
}